

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_GetImageOffsetTest_ImageOffsetArray_Test::TestBody
          (ktxTexture_GetImageOffsetTest_ImageOffsetArray_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  Message *pMVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_uint32_t levelRowBytes;
  ktx_uint32_t levelImageSize;
  ktx_uint32_t levelHeight;
  ktx_uint32_t levelWidth;
  ktx_uint32_t layerSize;
  ktx_uint32_t imageSize;
  ktx_uint32_t rowRounding;
  ktx_uint32_t rowBytes;
  ktx_size_t offset;
  ktx_size_t expectedOffset;
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe18) [28];
  AssertionResult *in_stack_fffffffffffffe20;
  ktx_error_code_e *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint uVar4;
  undefined4 in_stack_fffffffffffffe34;
  uint uVar5;
  char *in_stack_fffffffffffffe38;
  int line;
  char *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe9c;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_140 [2];
  undefined4 local_120;
  undefined4 local_11c;
  AssertionResult local_118;
  uint local_104;
  string local_100 [40];
  AssertHelper *local_d8;
  undefined1 local_c1;
  AssertionResult local_c0 [3];
  undefined4 local_8c;
  AssertionResult local_88;
  int local_78;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined1 local_58 [8];
  ulong local_50;
  undefined4 local_44;
  undefined4 local_40 [4];
  undefined4 local_30;
  int local_2c;
  undefined4 local_1c;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_10[0] = 0;
  TestCreateInfo::TestCreateInfo((TestCreateInfo *)0x145ec8);
  local_40[0] = 0x8051;
  local_30 = 9;
  local_1c = 3;
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_8c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffe38,
             (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28,(ktx_error_code_e *)in_stack_fffffffffffffe20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::AssertionResult::failure_message((AssertionResult *)0x145f71);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffea0,
               (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x145fce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14603c);
  local_c1 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe20,(bool *)in_stack_fffffffffffffe18,(type *)0x14606a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::Message::operator<<((Message *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe50 = (AssertHelper *)ktxErrorString(local_44);
    local_d8 = in_stack_fffffffffffffe50;
    pMVar3 = testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe20,(char **)in_stack_fffffffffffffe18);
    type = (Type)((ulong)pMVar3 >> 0x20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (char *)in_stack_fffffffffffffe80._M_head_impl);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffea0,
               (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_100);
    testing::Message::~Message((Message *)0x14618e);
  }
  local_104 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14623b);
  if (local_104 == 0) {
    local_5c = 0x1b;
    local_60 = 1;
    local_64 = local_2c * 0x1c;
    local_68 = local_64 * *(int *)(local_10[0] + 0x3c);
    local_50 = (ulong)(uint)(local_68 * *(int *)(local_10[0] + 0x38));
    local_11c = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,0,0,local_58);
    local_120 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,(ktx_error_code_e *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe40 =
           testing::AssertionResult::failure_message((AssertionResult *)0x146378);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,
                 (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x1463d5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x146443);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe38,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (unsigned_long *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1464b4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,
                 (Message *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x146511);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x146582);
    if (*(uint *)(local_10[0] + 0x24) >> 1 == 0) {
      uVar5 = 1;
    }
    else {
      uVar5 = *(uint *)(local_10[0] + 0x24) >> 1;
    }
    if (*(uint *)(local_10[0] + 0x28) >> 1 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = *(uint *)(local_10[0] + 0x28) >> 1;
    }
    local_60 = 3 - (uVar5 * 3 + 3 & 3);
    local_78 = local_60 + uVar5 * 3;
    local_74 = local_78 * uVar4;
    local_50 = (uint)(local_74 * 2) + local_50;
    local_70 = uVar4;
    local_6c = uVar5;
    uVar2 = (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],1,2,0,local_58);
    uVar6 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              (in_stack_fffffffffffffe38,(char *)CONCAT44(uVar5,uVar4),in_stack_fffffffffffffe28,
               (ktx_error_code_e *)in_stack_fffffffffffffe20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffea0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe28 =
           (ktx_error_code_e *)
           testing::AssertionResult::failure_message((AssertionResult *)0x14671d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(char *)CONCAT44(uVar5,uVar4));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,(Message *)CONCAT44(uVar2,uVar6));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
      testing::Message::~Message((Message *)0x14676b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1467d3);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe38,(char *)CONCAT44(uVar5,uVar4),
               (unsigned_long *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20
              );
    line = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe50);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x146838);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe50,type,in_stack_fffffffffffffe40,line,
                 (char *)CONCAT44(uVar5,uVar4));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffea0,(Message *)CONCAT44(uVar2,uVar6));
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x146886);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1468e8);
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_GetImageOffsetTest, ImageOffsetArray) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    ktx_size_t expectedOffset, offset;
    ktx_uint32_t rowBytes, rowRounding, imageSize, layerSize;
    ktx_uint32_t levelWidth, levelHeight, levelImageSize, levelRowBytes;

    createInfo.glInternalformat = GL_RGB8;
    createInfo.baseWidth = 9;
    createInfo.numLayers = 3;
    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    rowBytes = 9 * 3;
    rowRounding = ROUNDING(rowBytes);
    imageSize = (rowBytes + rowRounding) * createInfo.baseHeight;
    layerSize = imageSize * texture->numFaces;
    expectedOffset = layerSize * texture->numLayers;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 0, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    levelWidth = MAX(1, texture->baseWidth >> 1);
    levelHeight = MAX(1, texture->baseHeight >> 1);
    levelRowBytes = levelWidth * 3;
    rowRounding = ROUNDING(levelRowBytes);
    levelRowBytes += rowRounding;
    levelImageSize = levelRowBytes * levelHeight;
    expectedOffset += levelImageSize * 2;
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 1, 2, 0, &offset),
              KTX_SUCCESS);
    EXPECT_EQ(offset, expectedOffset);
    if (texture)
        ktxTexture_Destroy(texture);
}